

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

counting_iterator
fmt::v9::detail::write_escaped_cp<fmt::v9::detail::counting_iterator,char>
          (counting_iterator out,find_escape_result<char> *escape)

{
  uint32_t uVar1;
  char *s;
  counting_iterator cVar2;
  type count;
  counting_iterator local_d0;
  value_type local_c1;
  find_escape_result<char> *local_c0;
  size_t local_b8;
  byte local_a9;
  iterator pcStack_a8;
  char escape_char;
  iterator __end1;
  iterator __begin1;
  basic_string_view<char> *local_88;
  basic_string_view<char> *__range4;
  size_t local_78;
  size_t local_70;
  counting_iterator local_60;
  value_type local_53;
  char local_52 [2];
  counting_iterator local_50;
  value_type local_43;
  char local_42 [2];
  counting_iterator local_40;
  value_type local_33;
  char local_32 [2];
  counting_iterator local_30;
  value_type local_23;
  char local_22;
  char local_21;
  find_escape_result<char> *pfStack_20;
  char c;
  find_escape_result<char> *escape_local;
  counting_iterator out_local;
  
  local_21 = (char)escape->cp;
  uVar1 = escape->cp;
  pfStack_20 = escape;
  escape_local = (find_escape_result<char> *)out.count_;
  if (uVar1 == 9) {
    local_42[0] = '\\';
    local_50 = counting_iterator::operator++((counting_iterator *)&escape_local,0);
    counting_iterator::operator*(&local_50);
    counting_iterator::value_type::operator=(&local_43,local_42);
    local_21 = 't';
  }
  else if (uVar1 == 10) {
    local_22 = '\\';
    local_30 = counting_iterator::operator++((counting_iterator *)&escape_local,0);
    counting_iterator::operator*(&local_30);
    counting_iterator::value_type::operator=(&local_23,&local_22);
    local_21 = 'n';
  }
  else if (uVar1 == 0xd) {
    local_32[0] = '\\';
    local_40 = counting_iterator::operator++((counting_iterator *)&escape_local,0);
    counting_iterator::operator*(&local_40);
    counting_iterator::value_type::operator=(&local_33,local_32);
    local_21 = 'r';
  }
  else {
    if (((uVar1 != 0x22) && (uVar1 != 0x27)) && (uVar1 != 0x5c)) {
      if (escape->cp < 0x100) {
        local_70 = out.count_;
        cVar2 = write_codepoint<2ul,char,fmt::v9::detail::counting_iterator>(out,'x',escape->cp);
        return (counting_iterator)cVar2.count_;
      }
      if (escape->cp < 0x10000) {
        local_78 = out.count_;
        cVar2 = write_codepoint<4ul,char,fmt::v9::detail::counting_iterator>(out,'u',escape->cp);
        return (counting_iterator)cVar2.count_;
      }
      if (escape->cp < 0x110000) {
        __range4 = (basic_string_view<char> *)out.count_;
        cVar2 = write_codepoint<8ul,char,fmt::v9::detail::counting_iterator>(out,'U',escape->cp);
        return (counting_iterator)cVar2.count_;
      }
      s = escape->begin;
      count = to_unsigned<long>((long)escape->end - (long)escape->begin);
      basic_string_view<char>::basic_string_view((basic_string_view<char> *)&__begin1,s,count);
      local_88 = (basic_string_view<char> *)&__begin1;
      __end1 = basic_string_view<char>::begin(local_88);
      pcStack_a8 = basic_string_view<char>::end(local_88);
      for (; __end1 != pcStack_a8; __end1 = __end1 + 1) {
        local_a9 = *__end1;
        local_c0 = escape_local;
        local_b8 = (size_t)write_codepoint<2ul,char,fmt::v9::detail::counting_iterator>
                                     ((counting_iterator)escape_local,'x',(uint)local_a9);
        escape_local = (find_escape_result<char> *)local_b8;
      }
      return (counting_iterator)(counting_iterator)escape_local;
    }
    local_52[0] = '\\';
    local_60 = counting_iterator::operator++((counting_iterator *)&escape_local,0);
    counting_iterator::operator*(&local_60);
    counting_iterator::value_type::operator=(&local_53,local_52);
  }
  local_d0 = counting_iterator::operator++((counting_iterator *)&escape_local,0);
  counting_iterator::operator*(&local_d0);
  counting_iterator::value_type::operator=(&local_c1,&local_21);
  return (counting_iterator)(counting_iterator)escape_local;
}

Assistant:

auto write_escaped_cp(OutputIt out, const find_escape_result<Char>& escape)
    -> OutputIt {
  auto c = static_cast<Char>(escape.cp);
  switch (escape.cp) {
  case '\n':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('n');
    break;
  case '\r':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('r');
    break;
  case '\t':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('t');
    break;
  case '"':
    FMT_FALLTHROUGH;
  case '\'':
    FMT_FALLTHROUGH;
  case '\\':
    *out++ = static_cast<Char>('\\');
    break;
  default:
    if (is_utf8()) {
      if (escape.cp < 0x100) {
        return write_codepoint<2, Char>(out, 'x', escape.cp);
      }
      if (escape.cp < 0x10000) {
        return write_codepoint<4, Char>(out, 'u', escape.cp);
      }
      if (escape.cp < 0x110000) {
        return write_codepoint<8, Char>(out, 'U', escape.cp);
      }
    }
    for (Char escape_char : basic_string_view<Char>(
             escape.begin, to_unsigned(escape.end - escape.begin))) {
      out = write_codepoint<2, Char>(out, 'x',
                                     static_cast<uint32_t>(escape_char) & 0xFF);
    }
    return out;
  }
  *out++ = c;
  return out;
}